

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

Result __thiscall
presolve::HPresolve::colPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col)

{
  HighsLp *pHVar1;
  pointer piVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  Result RVar6;
  HighsInt HVar7;
  long lVar8;
  int iVar9;
  double *pdVar10;
  long lVar11;
  HighsInt *pHVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  pHVar1 = this->model;
  dVar13 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  dVar14 = (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col] - dVar13;
  dVar15 = this->primal_feastol;
  if (dVar14 <= dVar15) {
    if (dVar14 <= (this->options->super_HighsOptionsStruct).small_matrix_value) {
LAB_00311ad5:
      if (-dVar15 <= dVar14) {
        local_50.nodeValue =
             (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.nodeIndex =
             (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.nodeNext =
             (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_50.head =
             (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[col];
        HighsPostsolveStack::removedFixedCol<HighsTripletListSlice>
                  (postsolve_stack,col,dVar13,
                   (pHVar1->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[col],&local_50);
        removeFixedCol(this,col);
        RVar6 = checkLimits(this,postsolve_stack);
        return RVar6;
      }
      return kPrimalInfeasible;
    }
    lVar11 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[col];
    if (lVar11 == -1) {
      dVar16 = 0.0;
    }
    else {
      pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start + lVar11;
      dVar16 = 0.0;
      do {
        if (dVar16 <= ABS(*pdVar10)) {
          dVar16 = ABS(*pdVar10);
        }
        iVar9 = (int)lVar11;
        lVar11 = (long)(this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar9];
        pdVar10 = pdVar10 + (lVar11 - iVar9);
      } while (lVar11 != -1);
    }
    if (dVar16 * dVar14 <= dVar15) goto LAB_00311ad5;
  }
  iVar9 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[col];
  if (iVar9 == 1) {
    RVar6 = singletonCol(this,postsolve_stack,col);
    return RVar6;
  }
  if (iVar9 == 0) {
    RVar6 = emptyCol(this,postsolve_stack,col);
    return RVar6;
  }
  RVar6 = detectDominatedCol(this,postsolve_stack,col,true);
  if (RVar6 != kOk) {
    return RVar6;
  }
  if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[col] != '\0') {
    return kOk;
  }
  pHVar1 = this->model;
  dVar13 = (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  bVar3 = true;
  if (dVar13 < INFINITY) {
    bVar3 = (this->implColUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col] <= dVar13 + this->primal_feastol;
  }
  dVar13 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[col];
  if (-INFINITY < dVar13) {
    dVar15 = (this->implColLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[col];
    dVar13 = dVar13 - this->primal_feastol;
    bVar4 = dVar13 <= dVar15;
    if (this->mipsolver != (HighsMipSolver *)0x0) {
      if (dVar13 <= dVar15) goto LAB_00311bd5;
      bVar4 = false;
      goto LAB_00311cef;
    }
LAB_00311ef8:
    if (bVar4) goto LAB_00311efc;
  }
  else {
    if (this->mipsolver != (HighsMipSolver *)0x0) {
LAB_00311bd5:
      iVar9 = (this->colLowerSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[col];
      lVar11 = (long)iVar9;
      bVar4 = true;
      if ((((lVar11 != -1) &&
           ((this->impliedDualRowBounds).numInfSumUpperOrig.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [col] == 1)) &&
          (0.0 <= (pHVar1->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[col])) &&
         ((((pHVar1->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11] <= -INFINITY ||
           (INFINITY <=
            (pHVar1->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar11])) &&
          ((HVar7 = findNonzero(this,iVar9,col),
           (this->model->integrality_).
           super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
           super__Vector_impl_data._M_start[col] != kInteger ||
           (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11] ==
             (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar11] &&
            (bVar5 = rowCoefficientsIntegral
                               (this,iVar9,
                                1.0 / (this->Avalue).
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start[HVar7]), bVar5)))))))) {
        if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[HVar7] <= 0.0) {
          changeImplRowDualUpper(this,iVar9,0.0,col);
        }
        else {
          changeImplRowDualLower(this,iVar9,0.0,col);
        }
      }
LAB_00311cef:
      if (bVar3) {
        iVar9 = (this->colUpperSource).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[col];
        lVar11 = (long)iVar9;
        if ((((lVar11 != -1) &&
             ((this->impliedDualRowBounds).numInfSumLowerOrig.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
              [col] == 1)) &&
            (pHVar1 = this->model,
            (pHVar1->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[col] <= 0.0)) &&
           ((((pHVar1->row_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11] <= -INFINITY ||
             (INFINITY <=
              (pHVar1->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11])) &&
            ((HVar7 = findNonzero(this,iVar9,col),
             (this->model->integrality_).
             super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
             super__Vector_impl_data._M_start[col] != kInteger ||
             (((this->rowsizeInteger).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11] ==
               (this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar11] &&
              (bVar5 = rowCoefficientsIntegral
                                 (this,iVar9,
                                  1.0 / (this->Avalue).
                                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                        super__Vector_impl_data._M_start[HVar7]), bVar5)))))))) {
          if ((this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[HVar7] <= 0.0) {
            changeImplRowDualLower(this,iVar9,0.0,col);
          }
          else {
            changeImplRowDualUpper(this,iVar9,0.0,col);
          }
        }
      }
      convertImpliedInteger(this,col,-1,false);
      pHVar1 = this->model;
      if ((pHVar1->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
          _M_impl.super__Vector_impl_data._M_start[col] != kContinuous) {
        dVar13 = (pHVar1->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
        if ((((dVar13 != 0.0) || (NAN(dVar13))) &&
            (dVar15 = (pHVar1->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[col],
            dVar13 != -INFINITY || dVar15 != INFINITY)) && (0.5 < dVar15 - dVar13)) {
          if (ABS(dVar15) <= ABS(dVar13)) {
            if (ABS(dVar15) < 1000.5) {
              dVar14 = -1.0;
              goto LAB_00311eda;
            }
          }
          else if (ABS(dVar13) < 1000.5) {
            dVar14 = 1.0;
            dVar15 = dVar13;
LAB_00311eda:
            transformColumn(this,postsolve_stack,col,dVar14,dVar15);
          }
        }
      }
      if ((this->model->integrality_).
          super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
          super__Vector_impl_data._M_start[col] == kInteger) {
        return kOk;
      }
      goto LAB_00311ef8;
    }
LAB_00311efc:
    if ((this->impliedDualRowBounds).numInfSumUpper.super__Vector_base<int,_std::allocator<int>_>.
        _M_impl.super__Vector_impl_data._M_start[col] < 2) goto LAB_00311f25;
  }
  if (!bVar3) {
    return kOk;
  }
  if (1 < (this->impliedDualRowBounds).numInfSumLower.super__Vector_base<int,_std::allocator<int>_>.
          _M_impl.super__Vector_impl_data._M_start[col]) {
    return kOk;
  }
LAB_00311f25:
  lVar11 = (long)(this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[col];
  if (lVar11 != -1) {
    piVar2 = (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11;
    pHVar12 = (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start + lVar11;
    do {
      updateRowDualImpliedBounds(this,*pHVar12,col,*pdVar10);
      lVar8 = (long)(int)lVar11;
      lVar11 = (long)piVar2[lVar8];
      pHVar12 = pHVar12 + (lVar11 - lVar8);
      pdVar10 = pdVar10 + (lVar11 - lVar8);
    } while (lVar11 != -1);
  }
  return kOk;
}

Assistant:

HPresolve::Result HPresolve::colPresolve(HighsPostsolveStack& postsolve_stack,
                                         HighsInt col) {
  assert(!colDeleted[col]);
  const bool logging_on = analysis_.logging_on_;
  double boundDiff = model->col_upper_[col] - model->col_lower_[col];
  if (boundDiff <= primal_feastol) {
    if (boundDiff <= options->small_matrix_value ||
        getMaxAbsColVal(col) * boundDiff <= primal_feastol) {
      if (boundDiff < -primal_feastol) return Result::kPrimalInfeasible;
      postsolve_stack.removedFixedCol(col, model->col_lower_[col],
                                      model->col_cost_[col],
                                      getColumnVector(col));
      removeFixedCol(col);
      return checkLimits(postsolve_stack);
    }
  }

  switch (colsize[col]) {
    case 0:
      return emptyCol(postsolve_stack, col);
    case 1:
      return singletonCol(postsolve_stack, col);
    default:
      break;
  }

  // detect strong / weak domination
  HPRESOLVE_CHECKED_CALL(detectDominatedCol(postsolve_stack, col));
  if (colDeleted[col]) return Result::kOk;

  // column is not (weakly) dominated

  // the associated dual constraint has an upper bound if there is an infinite
  // or redundant column lower bound as then the reduced cost of the column must
  // not be positive i.e. <= 0
  bool dualConsHasUpper = isUpperImplied(col);
  bool dualConsHasLower = isLowerImplied(col);

  // integer columns cannot be used to tighten bounds on dual multipliers
  if (mipsolver != nullptr) {
    if (dualConsHasLower && colLowerSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumUpperOrig(col) == 1 &&
        model->col_cost_[col] >= 0) {
      HighsInt row = colLowerSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualLower(row, 0.0, col);
          else
            changeImplRowDualUpper(row, 0.0, col);
        }
      }
    }

    if (dualConsHasUpper && colUpperSource[col] != -1 &&
        impliedDualRowBounds.getNumInfSumLowerOrig(col) == 1 &&
        model->col_cost_[col] <= 0) {
      HighsInt row = colUpperSource[col];

      if (model->row_lower_[row] == -kHighsInf ||
          model->row_upper_[row] == kHighsInf) {
        HighsInt nzPos = findNonzero(row, col);

        if (model->integrality_[col] != HighsVarType::kInteger ||
            (rowsizeInteger[row] == rowsize[row] &&
             rowCoefficientsIntegral(row, 1.0 / Avalue[nzPos]))) {
          if (Avalue[nzPos] > 0)
            changeImplRowDualUpper(row, 0.0, col);
          else
            changeImplRowDualLower(row, 0.0, col);
        }
      }
    }

    convertImpliedInteger(col);

    // shift integral variables to have a lower bound of zero
    if (model->integrality_[col] != HighsVarType::kContinuous &&
        model->col_lower_[col] != 0.0 &&
        (model->col_lower_[col] != -kHighsInf ||
         model->col_upper_[col] != kHighsInf) &&
        model->col_upper_[col] - model->col_lower_[col] > 0.5) {
      // substitute with the bound that is smaller in magnitude and only
      // substitute if bound is not large for an integer
      if (std::abs(model->col_upper_[col]) > std::abs(model->col_lower_[col])) {
        if (std::abs(model->col_lower_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, 1.0, model->col_lower_[col]);
      } else {
        if (std::abs(model->col_upper_[col]) < 1000.5)
          transformColumn(postsolve_stack, col, -1.0, model->col_upper_[col]);
      }
    }

    if (model->integrality_[col] == HighsVarType::kInteger) return Result::kOk;
  }

  // now check if we can expect to tighten at least one bound
  if ((dualConsHasLower && impliedDualRowBounds.getNumInfSumUpper(col) <= 1) ||
      (dualConsHasUpper && impliedDualRowBounds.getNumInfSumLower(col) <= 1)) {
    for (const HighsSliceNonzero& nonzero : getColumnVector(col))
      updateRowDualImpliedBounds(nonzero.index(), col, nonzero.value());
  }

  return Result::kOk;
}